

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall
ThreadContext::RegisterTypeWithProtoPropertyCache
          (ThreadContext *this,PropertyId propertyId,Type *type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RecyclableData *pRVar4;
  Recycler *pRVar5;
  undefined1 local_60 [8];
  TrackAllocData data;
  TypeHashSet *typeHashSet;
  PropertyId propertyId_local;
  
  typeHashSet._4_4_ = propertyId;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xf75,"(propertyId != Js::Constants::NoProperty)",
                       "propertyId != Js::Constants::NoProperty");
    if (!bVar2) goto LAB_00715d1c;
    *puVar3 = 0;
  }
  bVar2 = IsActivePropertyId(this,propertyId);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xf76,"(IsActivePropertyId(propertyId))","IsActivePropertyId(propertyId)");
    if (!bVar2) goto LAB_00715d1c;
    *puVar3 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xf77,"(type)","type");
    if (!bVar2) {
LAB_00715d1c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pRVar4 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  data.line = 0;
  data._36_4_ = 0;
  bVar2 = JsUtil::
          BaseDictionary<int,_JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<int>(&pRVar4->typesWithProtoPropertyCache,(int *)((long)&typeHashSet + 4),
                             (WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>
                              **)&data.line);
  if (!bVar2) {
    local_60 = (undefined1  [8])
               &JsUtil::
                WeaklyReferencedKeyDictionary<Js::Type,bool,DefaultComparer<Js::Type_const*>,true>::
                typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_307ca64;
    data.filename._0_4_ = 0xf7d;
    pRVar5 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    data._32_8_ = new<Memory::Recycler>(0x50,pRVar5,0x37a1d4);
    pRVar5 = this->recycler;
    *(undefined4 *)data._32_8_ = 0;
    *(undefined8 *)(data._32_8_ + 0x18) = 0;
    *(undefined8 *)(data._32_8_ + 0x20) = 0;
    *(undefined8 *)(data._32_8_ + 8) = 0;
    *(undefined8 *)(data._32_8_ + 0x10) = 0;
    *(Recycler **)(data._32_8_ + 0x28) = pRVar5;
    *(undefined8 *)(data._32_8_ + 0x38) = 0;
    *(uint *)(data._32_8_ + 0x40) = pRVar5->weakReferenceCleanupId;
    *(undefined1 *)(data._32_8_ + 0x44) = 0;
    *(undefined4 *)(data._32_8_ + 0x48) = 0x4b;
    *(undefined8 *)(data._32_8_ + 0x30) = 0;
    JsUtil::
    BaseDictionary<int,JsUtil::WeaklyReferencedKeyDictionary<Js::Type,bool,DefaultComparer<Js::Type_const*>,true>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<int,JsUtil::WeaklyReferencedKeyDictionary<Js::Type,bool,DefaultComparer<Js::Type_const*>,true>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<int,JsUtil::WeaklyReferencedKeyDictionary<Js::Type,bool,DefaultComparer<Js::Type_const*>,true>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)&pRVar4->typesWithProtoPropertyCache,(int *)((long)&typeHashSet + 4),
               (WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>
                **)&data.line);
  }
  JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>::
  Item((WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true> *)
       data._32_8_,type,false);
  return;
}

Assistant:

void ThreadContext::RegisterTypeWithProtoPropertyCache(const Js::PropertyId propertyId, Js::Type *const type)
{
    Assert(propertyId != Js::Constants::NoProperty);
    Assert(IsActivePropertyId(propertyId));
    Assert(type);

    PropertyIdToTypeHashSetDictionary &typesWithProtoPropertyCache = recyclableData->typesWithProtoPropertyCache;
    TypeHashSet *typeHashSet = nullptr;
    if(!typesWithProtoPropertyCache.TryGetValue(propertyId, &typeHashSet))
    {
        typeHashSet = RecyclerNew(recycler, TypeHashSet, recycler);
        typesWithProtoPropertyCache.Add(propertyId, typeHashSet);
    }

    typeHashSet->Item(type, false);
}